

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O1

string * __thiscall
cmCMakePath::NativeString_abi_cxx11_(string *__return_storage_ptr__,cmCMakePath *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetNativePath(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string NativeString() const
  {
    std::string path;
    this->GetNativePath(path);

    return path;
  }